

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagateNoContraction.cpp
# Opt level: O0

void glslang::PropagateNoContraction(TIntermediate *intermediate)

{
  bool bVar1;
  __tuple_element_t<0UL,_tuple<unordered_multimap<basic_string<char>,_TIntermOperator_*,_hash<string>,_equal_to<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_TIntermOperator_*>_>_>,_unordered_map<TIntermTyped_*,_basic_string<char>,_hash<TIntermTyped_*>,_equal_to<TIntermTyped_*>,_allocator<pair<TIntermTyped_*const,_basic_string<char>_>_>_>,_unordered_set<basic_string<char>,_hash<string>,_equal_to<basic_string<char>_>,_allocator<basic_string<char>_>_>,_unordered_set<TIntermBranch_*,_hash<TIntermBranch_*>,_equal_to<TIntermBranch_*>,_allocator<TIntermBranch_*>_>_>_>
  *this;
  __tuple_element_t<1UL,_tuple<unordered_multimap<basic_string<char>,_TIntermOperator_*,_hash<string>,_equal_to<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_TIntermOperator_*>_>_>,_unordered_map<TIntermTyped_*,_basic_string<char>,_hash<TIntermTyped_*>,_equal_to<TIntermTyped_*>,_allocator<pair<TIntermTyped_*const,_basic_string<char>_>_>_>,_unordered_set<basic_string<char>,_hash<string>,_equal_to<basic_string<char>_>,_allocator<basic_string<char>_>_>,_unordered_set<TIntermBranch_*,_hash<TIntermBranch_*>,_equal_to<TIntermBranch_*>,_allocator<TIntermBranch_*>_>_>_>
  *accesschain_mapping_00;
  __tuple_element_t<2UL,_tuple<unordered_multimap<basic_string<char>,_TIntermOperator_*,_hash<string>,_equal_to<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_TIntermOperator_*>_>_>,_unordered_map<TIntermTyped_*,_basic_string<char>,_hash<TIntermTyped_*>,_equal_to<TIntermTyped_*>,_allocator<pair<TIntermTyped_*const,_basic_string<char>_>_>_>,_unordered_set<basic_string<char>,_hash<string>,_equal_to<basic_string<char>_>,_allocator<basic_string<char>_>_>,_unordered_set<TIntermBranch_*,_hash<TIntermBranch_*>,_equal_to<TIntermBranch_*>,_allocator<TIntermBranch_*>_>_>_>
  *precise_objects;
  __tuple_element_t<3UL,_tuple<unordered_multimap<basic_string<char>,_TIntermOperator_*,_hash<string>,_equal_to<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_TIntermOperator_*>_>_>,_unordered_map<TIntermTyped_*,_basic_string<char>,_hash<TIntermTyped_*>,_equal_to<TIntermTyped_*>,_allocator<pair<TIntermTyped_*const,_basic_string<char>_>_>_>,_unordered_set<basic_string<char>,_hash<string>,_equal_to<basic_string<char>_>,_allocator<basic_string<char>_>_>,_unordered_set<TIntermBranch_*,_hash<TIntermBranch_*>,_equal_to<TIntermBranch_*>,_allocator<TIntermBranch_*>_>_>_>
  *this_00;
  reference ppTVar2;
  reference pbVar3;
  pointer ppVar4;
  __tuple_element_t<0UL,_tuple<bool,_basic_string<char>_>_> *p_Var5;
  __tuple_element_t<1UL,_tuple<bool,_basic_string<char>_>_> *assignee_remained_accesschain;
  TIntermediate *in_RDX;
  ObjectAccessChain *remained_accesschain;
  bool *contain_precise;
  tuple<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  checker_result;
  TIntermOperator *defining_node;
  iterator defining_node_iter;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>,_false,_true>,_std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>,_false,_true>_>
  range;
  ObjectAccessChain symbol_id;
  undefined1 local_228 [8];
  ObjectAccessChain precise_object_accesschain;
  TIntermBranch *local_200;
  TIntermBranch *precise_return_node;
  TNoContractionPropagator propagator;
  TNoContractionAssigneeCheckingTraverser checker;
  ReturnBranchNodeSet *precise_return_nodes;
  ObjectAccesschainSet *precise_object_accesschains;
  AccessChainMapping *accesschain_mapping;
  NodeMapping *symbol_definition_mapping;
  tuple<std::unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>_>_>,_std::unordered_map<glslang::TIntermTyped_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<glslang::TIntermTyped_*>,_std::equal_to<glslang::TIntermTyped_*>,_std::allocator<std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::unordered_set<glslang::TIntermBranch_*,_std::hash<glslang::TIntermBranch_*>,_std::equal_to<glslang::TIntermBranch_*>,_std::allocator<glslang::TIntermBranch_*>_>_>
  mappings_and_precise_objects;
  TIntermediate *intermediate_local;
  
  mappings_and_precise_objects.
  super__Tuple_impl<0UL,_std::unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>_>_>,_std::unordered_map<glslang::TIntermTyped_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<glslang::TIntermTyped_*>,_std::equal_to<glslang::TIntermTyped_*>,_std::allocator<std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::unordered_set<glslang::TIntermBranch_*,_std::hash<glslang::TIntermBranch_*>,_std::equal_to<glslang::TIntermBranch_*>,_std::allocator<glslang::TIntermBranch_*>_>_>
  .
  super__Head_base<0UL,_std::unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>_>_>,_false>
  ._M_head_impl._M_h._M_single_bucket = (__node_base_ptr)intermediate;
  ::(anonymous_namespace)::getSymbolToDefinitionMappingAndPreciseSymbolIDs_abi_cxx11_
            ((tuple<std::unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>_>_>,_std::unordered_map<glslang::TIntermTyped_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<glslang::TIntermTyped_*>,_std::equal_to<glslang::TIntermTyped_*>,_std::allocator<std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::unordered_set<glslang::TIntermBranch_*,_std::hash<glslang::TIntermBranch_*>,_std::equal_to<glslang::TIntermBranch_*>,_std::allocator<glslang::TIntermBranch_*>_>_>
              *)&symbol_definition_mapping,(_anonymous_namespace_ *)intermediate,in_RDX);
  this = std::
         get<0ul,std::unordered_multimap<std::__cxx11::string,glslang::TIntermOperator*,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,glslang::TIntermOperator*>>>,std::unordered_map<glslang::TIntermTyped*,std::__cxx11::string,std::hash<glslang::TIntermTyped*>,std::equal_to<glslang::TIntermTyped*>,std::allocator<std::pair<glslang::TIntermTyped*const,std::__cxx11::string>>>,std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>,std::unordered_set<glslang::TIntermBranch*,std::hash<glslang::TIntermBranch*>,std::equal_to<glslang::TIntermBranch*>,std::allocator<glslang::TIntermBranch*>>>
                   ((tuple<std::unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>_>_>,_std::unordered_map<glslang::TIntermTyped_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<glslang::TIntermTyped_*>,_std::equal_to<glslang::TIntermTyped_*>,_std::allocator<std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::unordered_set<glslang::TIntermBranch_*,_std::hash<glslang::TIntermBranch_*>,_std::equal_to<glslang::TIntermBranch_*>,_std::allocator<glslang::TIntermBranch_*>_>_>
                     *)&symbol_definition_mapping);
  accesschain_mapping_00 =
       std::
       get<1ul,std::unordered_multimap<std::__cxx11::string,glslang::TIntermOperator*,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,glslang::TIntermOperator*>>>,std::unordered_map<glslang::TIntermTyped*,std::__cxx11::string,std::hash<glslang::TIntermTyped*>,std::equal_to<glslang::TIntermTyped*>,std::allocator<std::pair<glslang::TIntermTyped*const,std::__cxx11::string>>>,std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>,std::unordered_set<glslang::TIntermBranch*,std::hash<glslang::TIntermBranch*>,std::equal_to<glslang::TIntermBranch*>,std::allocator<glslang::TIntermBranch*>>>
                 ((tuple<std::unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>_>_>,_std::unordered_map<glslang::TIntermTyped_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<glslang::TIntermTyped_*>,_std::equal_to<glslang::TIntermTyped_*>,_std::allocator<std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::unordered_set<glslang::TIntermBranch_*,_std::hash<glslang::TIntermBranch_*>,_std::equal_to<glslang::TIntermBranch_*>,_std::allocator<glslang::TIntermBranch_*>_>_>
                   *)&symbol_definition_mapping);
  precise_objects =
       std::
       get<2ul,std::unordered_multimap<std::__cxx11::string,glslang::TIntermOperator*,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,glslang::TIntermOperator*>>>,std::unordered_map<glslang::TIntermTyped*,std::__cxx11::string,std::hash<glslang::TIntermTyped*>,std::equal_to<glslang::TIntermTyped*>,std::allocator<std::pair<glslang::TIntermTyped*const,std::__cxx11::string>>>,std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>,std::unordered_set<glslang::TIntermBranch*,std::hash<glslang::TIntermBranch*>,std::equal_to<glslang::TIntermBranch*>,std::allocator<glslang::TIntermBranch*>>>
                 ((tuple<std::unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>_>_>,_std::unordered_map<glslang::TIntermTyped_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<glslang::TIntermTyped_*>,_std::equal_to<glslang::TIntermTyped_*>,_std::allocator<std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::unordered_set<glslang::TIntermBranch_*,_std::hash<glslang::TIntermBranch_*>,_std::equal_to<glslang::TIntermBranch_*>,_std::allocator<glslang::TIntermBranch_*>_>_>
                   *)&symbol_definition_mapping);
  this_00 = std::
            get<3ul,std::unordered_multimap<std::__cxx11::string,glslang::TIntermOperator*,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,glslang::TIntermOperator*>>>,std::unordered_map<glslang::TIntermTyped*,std::__cxx11::string,std::hash<glslang::TIntermTyped*>,std::equal_to<glslang::TIntermTyped*>,std::allocator<std::pair<glslang::TIntermTyped*const,std::__cxx11::string>>>,std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>,std::unordered_set<glslang::TIntermBranch*,std::hash<glslang::TIntermBranch*>,std::equal_to<glslang::TIntermBranch*>,std::allocator<glslang::TIntermBranch*>>>
                      ((tuple<std::unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>_>_>,_std::unordered_map<glslang::TIntermTyped_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<glslang::TIntermTyped_*>,_std::equal_to<glslang::TIntermTyped_*>,_std::allocator<std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::unordered_set<glslang::TIntermBranch_*,_std::hash<glslang::TIntermBranch_*>,_std::equal_to<glslang::TIntermBranch_*>,_std::allocator<glslang::TIntermBranch_*>_>_>
                        *)&symbol_definition_mapping);
  anon_unknown.dwarf_d5791a::TNoContractionAssigneeCheckingTraverser::
  TNoContractionAssigneeCheckingTraverser
            ((TNoContractionAssigneeCheckingTraverser *)&propagator.accesschain_mapping_,
             accesschain_mapping_00);
  anon_unknown.dwarf_d5791a::TNoContractionPropagator::TNoContractionPropagator
            ((TNoContractionPropagator *)&precise_return_node,precise_objects,accesschain_mapping_00
            );
  while (bVar1 = std::
                 unordered_set<glslang::TIntermBranch_*,_std::hash<glslang::TIntermBranch_*>,_std::equal_to<glslang::TIntermBranch_*>,_std::allocator<glslang::TIntermBranch_*>_>
                 ::empty(this_00), ((bVar1 ^ 0xffU) & 1) != 0) {
    precise_object_accesschain.field_2._8_8_ =
         std::
         unordered_set<glslang::TIntermBranch_*,_std::hash<glslang::TIntermBranch_*>,_std::equal_to<glslang::TIntermBranch_*>,_std::allocator<glslang::TIntermBranch_*>_>
         ::begin(this_00);
    ppTVar2 = std::__detail::_Node_iterator<glslang::TIntermBranch_*,_true,_false>::operator*
                        ((_Node_iterator<glslang::TIntermBranch_*,_true,_false> *)
                         ((long)&precise_object_accesschain.field_2 + 8));
    local_200 = *ppTVar2;
    anon_unknown.dwarf_d5791a::TNoContractionPropagator::propagateNoContractionInReturnNode
              ((TNoContractionPropagator *)&precise_return_node,local_200);
    std::
    unordered_set<glslang::TIntermBranch_*,_std::hash<glslang::TIntermBranch_*>,_std::equal_to<glslang::TIntermBranch_*>,_std::allocator<glslang::TIntermBranch_*>_>
    ::erase(this_00,&local_200);
  }
  while (bVar1 = std::
                 unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::empty(precise_objects), ((bVar1 ^ 0xffU) & 1) != 0) {
    symbol_id.field_2._8_8_ =
         std::
         unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(precise_objects);
    pbVar3 = std::__detail::
             _Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
             ::operator*((_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                          *)((long)&symbol_id.field_2 + 8));
    std::__cxx11::string::string((string *)local_228,(string *)pbVar3);
    anon_unknown.dwarf_d5791a::getFrontElement
              ((ObjectAccessChain *)&range.second,(ObjectAccessChain *)local_228);
    _defining_node_iter =
         std::
         unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>_>_>
         ::equal_range(this,(key_type *)&range.second);
    defining_node =
         (TIntermOperator *)
         defining_node_iter.
         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>,_true>
         ._M_cur;
    while (bVar1 = std::__detail::operator!=
                             ((_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>,_true>
                               *)&defining_node,
                              (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>,_true>
                               *)&range), bVar1) {
      ppVar4 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>,_false,_true>
                             *)&defining_node);
      checker_result.
      super__Tuple_impl<0UL,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._32_8_ = ppVar4->second;
      anon_unknown.dwarf_d5791a::TNoContractionAssigneeCheckingTraverser::
      getPrecisenessAndRemainedAccessChain
                ((tuple<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&contain_precise,
                 (TNoContractionAssigneeCheckingTraverser *)&propagator.accesschain_mapping_,
                 (TIntermOperator *)
                 checker_result.
                 super__Tuple_impl<0UL,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ._32_8_,(ObjectAccessChain *)local_228);
      p_Var5 = std::get<0ul,bool,std::__cxx11::string>
                         ((tuple<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&contain_precise);
      assignee_remained_accesschain =
           std::get<1ul,bool,std::__cxx11::string>
                     ((tuple<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&contain_precise);
      if ((*p_Var5 & 1U) != 0) {
        anon_unknown.dwarf_d5791a::TNoContractionPropagator::propagateNoContractionInOneExpression
                  ((TNoContractionPropagator *)&precise_return_node,
                   (TIntermTyped *)
                   checker_result.
                   super__Tuple_impl<0UL,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ._32_8_,assignee_remained_accesschain);
      }
      std::
      tuple<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~tuple((tuple<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&contain_precise);
      std::__detail::
      _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>,_false,_true>
      ::operator++((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>,_false,_true>
                    *)&defining_node,0);
    }
    std::
    unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::erase(precise_objects,(key_type *)local_228);
    std::__cxx11::string::~string((string *)&range.second);
    std::__cxx11::string::~string((string *)local_228);
  }
  anon_unknown.dwarf_d5791a::TNoContractionPropagator::~TNoContractionPropagator
            ((TNoContractionPropagator *)&precise_return_node);
  anon_unknown.dwarf_d5791a::TNoContractionAssigneeCheckingTraverser::
  ~TNoContractionAssigneeCheckingTraverser
            ((TNoContractionAssigneeCheckingTraverser *)&propagator.accesschain_mapping_);
  std::
  tuple<std::unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>_>_>,_std::unordered_map<glslang::TIntermTyped_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<glslang::TIntermTyped_*>,_std::equal_to<glslang::TIntermTyped_*>,_std::allocator<std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::unordered_set<glslang::TIntermBranch_*,_std::hash<glslang::TIntermBranch_*>,_std::equal_to<glslang::TIntermBranch_*>,_std::allocator<glslang::TIntermBranch_*>_>_>
  ::~tuple((tuple<std::unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>_>_>,_std::unordered_map<glslang::TIntermTyped_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<glslang::TIntermTyped_*>,_std::equal_to<glslang::TIntermTyped_*>,_std::allocator<std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::unordered_set<glslang::TIntermBranch_*,_std::hash<glslang::TIntermBranch_*>,_std::equal_to<glslang::TIntermBranch_*>,_std::allocator<glslang::TIntermBranch_*>_>_>
            *)&symbol_definition_mapping);
  return;
}

Assistant:

void PropagateNoContraction(const glslang::TIntermediate& intermediate)
{
    // First, traverses the AST, records symbols with their defining operations
    // and collects the initial set of precise symbols (symbol nodes that marked
    // as 'noContraction') and precise return nodes.
    auto mappings_and_precise_objects =
        getSymbolToDefinitionMappingAndPreciseSymbolIDs(intermediate);

    // The mapping of symbol node IDs to their defining nodes. This enables us
    // to get the defining node directly from a given symbol ID without
    // traversing the tree again.
    NodeMapping& symbol_definition_mapping = std::get<0>(mappings_and_precise_objects);

    // The mapping of object nodes to their access chains recorded.
    AccessChainMapping& accesschain_mapping = std::get<1>(mappings_and_precise_objects);

    // The initial set of 'precise' objects which are represented as the
    // access chain toward them.
    ObjectAccesschainSet& precise_object_accesschains = std::get<2>(mappings_and_precise_objects);

    // The set of 'precise' return nodes.
    ReturnBranchNodeSet& precise_return_nodes = std::get<3>(mappings_and_precise_objects);

    // Second, uses the initial set of precise objects as a work list, pops an
    // access chain, extract the symbol ID from it. Then:
    //  1) Check the assignee object, see if it is 'precise' object node or
    //  contains 'precise' object. Obtain the incremental access chain from the
    //  assignee node to its nested 'precise' node (if any).
    //  2) If the assignee object node is 'precise' or it contains 'precise'
    //  objects, traverses the right side of the assignment operation
    //  expression to mark arithmetic operations as 'noContration' and update
    //  'precise' access chain work list with new found object nodes.
    // Repeat above steps until the work list is empty.
    TNoContractionAssigneeCheckingTraverser checker(accesschain_mapping);
    TNoContractionPropagator propagator(&precise_object_accesschains, accesschain_mapping);

    // We have two initial precise work lists to handle:
    //  1) precise return nodes
    //  2) precise object access chains
    // We should process the precise return nodes first and the involved
    // objects in the return expression should be added to the precise object
    // access chain set.
    while (!precise_return_nodes.empty()) {
        glslang::TIntermBranch* precise_return_node = *precise_return_nodes.begin();
        propagator.propagateNoContractionInReturnNode(precise_return_node);
        precise_return_nodes.erase(precise_return_node);
    }

    while (!precise_object_accesschains.empty()) {
        // Get the access chain of a precise object from the work list.
        ObjectAccessChain precise_object_accesschain = *precise_object_accesschains.begin();
        // Get the symbol id from the access chain.
        ObjectAccessChain symbol_id = getFrontElement(precise_object_accesschain);
        // Get all the defining nodes of that symbol ID.
        std::pair<NodeMapping::iterator, NodeMapping::iterator> range =
            symbol_definition_mapping.equal_range(symbol_id);
        // Visits all the assignment nodes of that symbol ID and
        //  1) Check if the assignee node is 'precise' or contains 'precise'
        //  objects.
        //  2) Propagate the 'precise' to the top layer object nodes
        //  in the right side of the assignment operation, update the 'precise'
        //  work list with new access chains representing the new 'precise'
        //  objects, and mark arithmetic operations as 'noContraction'.
        for (NodeMapping::iterator defining_node_iter = range.first;
             defining_node_iter != range.second; defining_node_iter++) {
            TIntermOperator* defining_node = defining_node_iter->second;
            // Check the assignee node.
            auto checker_result = checker.getPrecisenessAndRemainedAccessChain(
                defining_node, precise_object_accesschain);
            bool& contain_precise = std::get<0>(checker_result);
            ObjectAccessChain& remained_accesschain = std::get<1>(checker_result);
            // If the assignee node is 'precise' or contains 'precise', propagate the
            // 'precise' to the right. Otherwise just skip this assignment node.
            if (contain_precise) {
                propagator.propagateNoContractionInOneExpression(defining_node,
                                                                 remained_accesschain);
            }
        }
        // Remove the last processed 'precise' object from the work list.
        precise_object_accesschains.erase(precise_object_accesschain);
    }
}